

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O1

void __thiscall Activation::set(Activation *this,uint index,PARAM_NAME *param_name,double value)

{
  pointer pFVar1;
  ulong uVar2;
  
  uVar2 = (ulong)index;
  pFVar1 = (this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_params).super__Vector_base<Func_Param,_std::allocator<Func_Param>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 5) <= uVar2) {
    std::operator<<((ostream *)&std::cout,"ERROR [activation set]: Index out of bounds!\n");
    exit(1);
  }
  switch(*param_name) {
  case MID_POINT:
    pFVar1[uVar2].middle = value;
    return;
  case LENGTH:
    pFVar1[uVar2].length = value;
    return;
  case AMPLITUDE:
    pFVar1[uVar2].amplitude = value;
    return;
  case CONFIDENCE:
    pFVar1[uVar2].confidence = (uint)(long)value;
  }
  return;
}

Assistant:

void Activation::set(unsigned index, const PARAM_NAME& param_name, double value){
    if(index>=m_params.size()){
        std::cout<<"ERROR [activation set]: Index out of bounds!\n";
        exit(1);
    }
    
    switch (param_name)
    {
    case MID_POINT:
        m_params[index].middle=value;
        break;
    case LENGTH:
        m_params[index].length=value;
        break;
    case AMPLITUDE:
        m_params[index].amplitude=value;
        break;
    case CONFIDENCE:
        m_params[index].confidence=(unsigned)value;
        break;
    default: break;
    }
}